

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void prvTidyParseScript(TidyDocImpl *doc,Node *script,GetTokenMode mode)

{
  Node *pNVar1;
  Node *node;
  GetTokenMode mode_local;
  Node *script_local;
  TidyDocImpl *doc_local;
  
  doc->lexer->parent = script;
  pNVar1 = prvTidyGetToken(doc,CdataContent);
  doc->lexer->parent = (Node *)0x0;
  if (pNVar1 == (Node *)0x0) {
    prvTidyReport(doc,script,(Node *)0x0,0x25a);
  }
  else {
    prvTidyInsertNodeAtEnd(script,pNVar1);
    pNVar1 = prvTidyGetToken(doc,IgnoreWhitespace);
    if ((((pNVar1 == (Node *)0x0) || (pNVar1->type != EndTag)) || (pNVar1->tag == (Dict *)0x0)) ||
       (pNVar1->tag->id != script->tag->id)) {
      prvTidyReport(doc,script,pNVar1,0x25a);
      if (pNVar1 != (Node *)0x0) {
        prvTidyUngetToken(doc);
      }
    }
    else {
      prvTidyFreeNode(doc,pNVar1);
    }
  }
  return;
}

Assistant:

void TY_(ParseScript)(TidyDocImpl* doc, Node *script, GetTokenMode ARG_UNUSED(mode))
{
    Node *node;
    
    doc->lexer->parent = script;
    node = TY_(GetToken)(doc, CdataContent);
    doc->lexer->parent = NULL;

    if (node)
    {
        TY_(InsertNodeAtEnd)(script, node);
    }
    else
    {
        /* handle e.g. a document like "<script>" */
        TY_(Report)(doc, script, NULL, MISSING_ENDTAG_FOR);
        return;
    }

    node = TY_(GetToken)(doc, IgnoreWhitespace);

    if (!(node && node->type == EndTag && node->tag &&
        node->tag->id == script->tag->id))
    {
        TY_(Report)(doc, script, node, MISSING_ENDTAG_FOR);

        if (node)
            TY_(UngetToken)(doc);
    }
    else
    {
        TY_(FreeNode)(doc, node);
    }
}